

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_parseAndPrintCombinedImportsInString_Test::~Parser_parseAndPrintCombinedImportsInString_Test
          (Parser_parseAndPrintCombinedImportsInString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseAndPrintCombinedImportsInString)
{
    const std::string combinedInString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"everything\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <units units_ref=\"a_units_in_that_model\" name=\"units1\"/>\n"
        "    <component component_ref=\"a_component_in_that_model\" name=\"component1\"/>\n"
        "  </import>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto modelCombined = parser->parseModel(combinedInString);

    auto printer = libcellml::Printer::create();
    EXPECT_EQ(combinedInString, printer->printModel(modelCombined));
}